

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  size_type *psVar1;
  size_t sVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string file_name;
  int local_7c;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string local_58;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_7c = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_38 = local_28;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,this + sVar2);
  if (local_7c < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_38,local_30 + (long)local_38);
    goto LAB_001f8899;
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_38,local_30 + (long)local_38);
  std::__cxx11::string::append((char *)&local_78);
  StreamableToString<int>(&local_58,&local_7c);
  uVar4 = 0xf;
  if (local_78 != local_68) {
    uVar4 = local_68[0];
  }
  if (uVar4 < local_58._M_string_length + local_70) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar5 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_58._M_string_length + local_70) goto LAB_001f87e6;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
  }
  else {
LAB_001f87e6:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar5 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
LAB_001f8899:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}